

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O1

fdb_txn * wal_earliest_txn(filemgr *file,fdb_txn *cur_txn)

{
  fdb_txn *pfVar1;
  list_elem *plVar2;
  uint64_t uVar3;
  fdb_txn *pfVar4;
  
  pthread_spin_lock(&file->wal->lock);
  plVar2 = (file->wal->txn_list).head;
  if (plVar2 == (list_elem *)0x0) {
    pfVar4 = (fdb_txn *)0x0;
  }
  else {
    uVar3 = 0;
    pfVar4 = (fdb_txn *)0x0;
    do {
      pfVar1 = (fdb_txn *)plVar2[1].prev;
      if (((pfVar1 != cur_txn) && (pfVar1->items->head != (list_elem *)0x0)) &&
         ((uVar3 == 0 || (pfVar1->prev_revnum < uVar3)))) {
        uVar3 = pfVar1->prev_revnum;
        pfVar4 = pfVar1;
      }
      plVar2 = plVar2->next;
    } while (plVar2 != (list_elem *)0x0);
  }
  pthread_spin_unlock(&file->wal->lock);
  return pfVar4;
}

Assistant:

fdb_txn * wal_earliest_txn(struct filemgr *file, fdb_txn *cur_txn)
{
    struct list_elem *le;
    struct wal_txn_wrapper *txn_wrapper;
    fdb_txn *txn;
    fdb_txn *ret = NULL;
    uint64_t min_revnum = 0;

    spin_lock(&file->wal->lock);

    le = list_begin(&file->wal->txn_list);
    while(le) {
        txn_wrapper = _get_entry(le, struct wal_txn_wrapper, le);
        txn = txn_wrapper->txn;

        if (txn != cur_txn && list_begin(txn->items)) {
            if (min_revnum == 0 || txn->prev_revnum < min_revnum) {
                min_revnum = txn->prev_revnum;
                ret = txn;
            }
        }
        le = list_next(le);
    }
    spin_unlock(&file->wal->lock);

    return ret;
}